

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_3dVector *
ON_TriangleNormal(ON_3dVector *__return_storage_ptr__,ON_3dPoint *A,ON_3dPoint *B,ON_3dPoint *C)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar4 = B->y;
  dVar6 = B->z;
  dVar7 = C->y;
  dVar8 = C->z;
  dVar5 = A->y;
  dVar10 = A->z;
  dVar9 = (dVar10 - dVar6) * dVar7 + (dVar6 - dVar8) * dVar5 + (dVar8 - dVar10) * dVar4;
  __return_storage_ptr__->x = dVar9;
  dVar1 = B->x;
  dVar2 = C->x;
  dVar3 = A->x;
  dVar10 = (dVar3 - dVar1) * dVar8 + (dVar1 - dVar2) * dVar10 + (dVar2 - dVar3) * dVar6;
  __return_storage_ptr__->y = dVar10;
  dVar8 = (dVar5 - dVar4) * dVar2 + (dVar4 - dVar7) * dVar3 + (dVar7 - dVar5) * dVar1;
  __return_storage_ptr__->z = dVar8;
  dVar4 = ABS(dVar9);
  dVar6 = ABS(dVar10);
  dVar7 = ABS(dVar8);
  if (dVar6 <= dVar4) {
    if (dVar4 < dVar7) goto LAB_005170ba;
    dVar5 = dVar4;
    if (dVar4 <= 2.2250738585072014e-308) goto LAB_00517169;
    dVar5 = (dVar7 / dVar4) * (dVar7 / dVar4) + (dVar6 / dVar4) * (dVar6 / dVar4) + 1.0;
  }
  else if (dVar7 <= dVar6) {
    dVar5 = dVar6;
    if (dVar6 <= 2.2250738585072014e-308) goto LAB_00517169;
    dVar5 = (dVar4 / dVar6) * (dVar4 / dVar6) + (dVar7 / dVar6) * (dVar7 / dVar6) + 1.0;
    dVar4 = dVar6;
  }
  else {
LAB_005170ba:
    dVar5 = dVar7;
    if (dVar7 <= 2.2250738585072014e-308) goto LAB_00517169;
    dVar5 = (dVar6 / dVar7) * (dVar6 / dVar7) + (dVar4 / dVar7) * (dVar4 / dVar7) + 1.0;
    dVar4 = dVar7;
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar5 = dVar4 * dVar5;
LAB_00517169:
  if (0.0 < dVar5) {
    __return_storage_ptr__->x = dVar9 / dVar5;
    __return_storage_ptr__->y = dVar10 / dVar5;
    __return_storage_ptr__->z = dVar8 / dVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_TriangleNormal(
        const ON_3dPoint& A,
        const ON_3dPoint& B,
        const ON_3dPoint& C
        )
{
  // N = normal to triangle's plane
  ON_3dVector N;
  double a, b, c, d;
  N.x = A.y*(B.z-C.z) + B.y*(C.z-A.z) + C.y*(A.z-B.z);
  N.y = A.z*(B.x-C.x) + B.z*(C.x-A.x) + C.z*(A.x-B.x);
  N.z = A.x*(B.y-C.y) + B.x*(C.y-A.y) + C.x*(A.y-B.y);

  a = fabs(N.x);
  b = fabs(N.y);
  c = fabs(N.z);
  if ( b > a )
  {
    if ( c > b )
    {
      // c is largest
      if ( c > ON_DBL_MIN )
      {
        a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
      }
      else
      {
        d = c;
      }
    }
    else
    {
      if ( b > ON_DBL_MIN )
      {
        // b is largest
        a /= b; c /= b; d = b*sqrt(1.0 + c*c + a*a);
      }
      else
      {
        d = b;
      }
    }
  }
  else if ( c > a )
  {
    // c is largest
    if ( c > ON_DBL_MIN )
    {
      a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
    }
    else
    {
      d = c;
    }
  }
  else if ( a > ON_DBL_MIN )
  {
    // a is largest
    b /= a; c /= a; d = a*sqrt(1.0 + b*b + c*c);
  }
  else
  {
    d = a;
  }

  if ( d > 0.0 )
  {
    N.x /= d; N.y /= d; N.z /= d;
  }

  return N;
}